

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

target_ulong helper_sraw_ppc64(CPUPPCState_conflict2 *env,target_ulong value,target_ulong shift)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)value;
  if ((shift & 0x20) == 0) {
    if ((shift & 0xffffffdf) == 0) {
      env->ca = 0;
      env->ca32 = 0;
      uVar1 = uVar2;
    }
    else {
      uVar1 = (int)uVar2 >> ((byte)shift & 0x1f);
      if (((int)uVar1 < 0) && ((uVar2 & ~(-1 << ((byte)shift & 0x1f))) != 0)) {
        env->ca = 1;
        env->ca32 = 1;
      }
      else {
        env->ca = 0;
        env->ca32 = 0;
      }
    }
  }
  else {
    uVar1 = (int)uVar2 >> 0x1f;
    env->ca = (ulong)(uVar2 >> 0x1f);
    env->ca32 = (ulong)(uVar2 >> 0x1f);
  }
  return (long)(int)uVar1;
}

Assistant:

target_ulong helper_sraw(CPUPPCState *env, target_ulong value,
                         target_ulong shift)
{
    int32_t ret;

    if (likely(!(shift & 0x20))) {
        if (likely((uint32_t)shift != 0)) {
            shift &= 0x1f;
            ret = (int32_t)value >> shift;
            if (likely(ret >= 0 || (value & ((1 << shift) - 1)) == 0)) {
                env->ca32 = env->ca = 0;
            } else {
                env->ca32 = env->ca = 1;
            }
        } else {
            ret = (int32_t)value;
            env->ca32 = env->ca = 0;
        }
    } else {
        ret = (int32_t)value >> 31;
        env->ca32 = env->ca = (ret != 0);
    }
    return (target_long)ret;
}